

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O3

void __thiscall
NaPolynomialFunc::NaPolynomialFunc(NaPolynomialFunc *this,char *szOptions,NaVector *vInit)

{
  NaDynAr<double> *pNVar1;
  double dVar2;
  int iVar3;
  char *__s;
  char *__nptr;
  double *pdVar4;
  undefined4 extraout_var;
  uint uVar5;
  char *szRest;
  char *local_38;
  
  NaExternFunc::NaExternFunc(&this->super_NaExternFunc);
  *(undefined ***)this = &PTR_PrintLog_00104c50;
  pNVar1 = &this->vfK;
  (this->vfK)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00104cd8;
  (this->vfK).nItems = 0;
  (this->vfK).pHead = (item *)0x0;
  (this->vfK).pTail = (item *)0x0;
  __s = strdup(szOptions);
  __nptr = strtok(__s," ");
  if (__nptr != (char *)0x0) {
    do {
      dVar2 = strtod(__nptr,&local_38);
      if (local_38 != __nptr) {
        pdVar4 = (double *)operator_new(8);
        *pdVar4 = dVar2;
        (*pNVar1->_vptr_NaDynAr[5])(pNVar1,pdVar4);
      }
      __nptr = strtok((char *)0x0," ");
    } while (__nptr != (char *)0x0);
  }
  free(__s);
  NaPrintLog("polynomial coefficients:");
  uVar5 = (this->vfK).nItems;
  while (0 < (int)uVar5) {
    uVar5 = uVar5 - 1;
    iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar5);
    NaPrintLog(" k[%d]=%g",(int)*(undefined8 *)CONCAT44(extraout_var,iVar3),(ulong)uVar5);
  }
  NaPrintLog("\n");
  return;
}

Assistant:

NaPolynomialFunc::NaPolynomialFunc (char* szOptions, NaVector& vInit)
{
    char	*szThis = strdup(szOptions), *szRest, *szToken;
    NaReal	fTest;

    for(szToken = strtok(szThis, " ");
	NULL != szToken;
	szToken = strtok(NULL, " ")) {
	// Check for proper floating point number
	fTest = strtod(szToken, &szRest);
	if(szRest == szToken)
	    continue;
	vfK.addl(fTest);
    }
    free(szThis);

    NaPrintLog("polynomial coefficients:");
    for(int i = vfK.count()-1; i >= 0; --i) {
	NaPrintLog(" k[%d]=%g", i, vfK[i]);
    }
    NaPrintLog("\n");
}